

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_basic.c
# Opt level: O2

amqp_connection_state_t setup_connection_and_channel(void)

{
  uint __line;
  int iVar1;
  amqp_connection_state_t state;
  amqp_socket_t *self;
  amqp_channel_open_ok_t *paVar2;
  char *__assertion;
  amqp_rpc_reply_t rpc_reply;
  
  state = amqp_new_connection();
  self = amqp_tcp_socket_new(state);
  if (self == (amqp_socket_t *)0x0) {
    __assertion = "socket";
    __line = 0x1e;
  }
  else {
    iVar1 = amqp_socket_open(self,"localhost",0x1628);
    if (iVar1 == 0) {
      amqp_login(&rpc_reply,state,"/",1,0x20000,0,AMQP_SASL_METHOD_PLAIN,"guest","guest");
      if (rpc_reply.reply_type == AMQP_RESPONSE_NORMAL) {
        paVar2 = amqp_channel_open(state,1);
        if (paVar2 != (amqp_channel_open_ok_t *)0x0) {
          return state;
        }
        __assertion = "res != NULL";
        __line = 0x2a;
      }
      else {
        __assertion = "rpc_reply.reply_type == AMQP_RESPONSE_NORMAL";
        __line = 0x26;
      }
    }
    else {
      __assertion = "rc == AMQP_STATUS_OK";
      __line = 0x21;
    }
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alanxz[P]rabbitmq-c/tests/test_basic.c"
                ,__line,"amqp_connection_state_t setup_connection_and_channel(void)");
}

Assistant:

amqp_connection_state_t setup_connection_and_channel(void) {
  amqp_connection_state_t connection_state_ = amqp_new_connection();

  amqp_socket_t *socket = amqp_tcp_socket_new(connection_state_);
  assert(socket);

  int rc = amqp_socket_open(socket, "localhost", AMQP_PROTOCOL_PORT);
  assert(rc == AMQP_STATUS_OK);

  amqp_rpc_reply_t rpc_reply = amqp_login(
      connection_state_, "/", 1, AMQP_DEFAULT_FRAME_SIZE,
      AMQP_DEFAULT_HEARTBEAT, AMQP_SASL_METHOD_PLAIN, "guest", "guest");
  assert(rpc_reply.reply_type == AMQP_RESPONSE_NORMAL);

  amqp_channel_open_ok_t *res =
      amqp_channel_open(connection_state_, fixed_channel_id);
  assert(res != NULL);

  return connection_state_;
}